

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 in_EAX;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  float fVar27;
  float fVar28;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar38;
  float fVar40;
  undefined1 auVar34 [16];
  float fVar42;
  undefined1 auVar35 [16];
  float fVar39;
  float fVar41;
  float fVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  batch bVar48;
  
  fVar27 = cos_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar28 = cos_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[1];
  fVar13 = ctx->cos_start_angle;
  iVar18 = -(uint)(fVar27 < fVar13);
  iVar20 = -(uint)(fVar28 < fVar13);
  auVar31._4_4_ = iVar20;
  auVar31._0_4_ = iVar18;
  auVar31._8_4_ = -(uint)(in_XMM0_Dc < fVar13);
  auVar31._12_4_ = -(uint)(in_XMM0_Dd < fVar13);
  iVar17 = movmskps(in_EAX,auVar31);
  if (iVar17 == 0) {
    uVar29 = 0x3f8000003f800000;
  }
  else {
    fVar14 = ctx->cos_end_angle;
    auVar47._4_4_ = -(uint)(fVar14 < fVar28);
    auVar47._0_4_ = -(uint)(fVar14 < fVar27);
    auVar47._8_4_ = -(uint)(fVar14 < in_XMM0_Dc);
    auVar47._12_4_ = -(uint)(fVar14 < in_XMM0_Dd);
    iVar17 = movmskps(iVar17,auVar47);
    if (iVar17 == 0) {
      uVar29 = 0;
    }
    else {
      iVar17 = -(uint)(0.5 < ABS(fVar27));
      iVar21 = -(uint)(0.5 < ABS(fVar28));
      iVar23 = -(uint)(0.5 < ABS(in_XMM0_Dc));
      iVar25 = -(uint)(0.5 < ABS(in_XMM0_Dd));
      auVar30._0_4_ = 0.5 - ABS(fVar27) * 0.5;
      auVar30._4_4_ = 0.5 - ABS(fVar28) * 0.5;
      auVar30._8_4_ = 0.5 - ABS(in_XMM0_Dc) * 0.5;
      auVar30._12_4_ = 0.5 - ABS(in_XMM0_Dd) * 0.5;
      auVar31 = sqrtps(auVar30,auVar30);
      auVar34._0_8_ =
           cos_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data.
           _0_8_;
      auVar34._8_4_ = in_XMM0_Dc;
      auVar34._12_4_ = in_XMM0_Dd;
      auVar1._4_4_ = iVar21;
      auVar1._0_4_ = iVar17;
      auVar1._8_4_ = iVar23;
      auVar1._12_4_ = iVar25;
      auVar31 = blendvps(auVar34,auVar31,auVar1);
      fVar32 = auVar31._0_4_;
      fVar38 = auVar31._4_4_;
      auVar44._0_8_ = auVar31._0_8_ & 0x7fffffff7fffffff;
      fVar40 = auVar31._8_4_;
      auVar44._8_4_ = ABS(fVar40);
      fVar42 = auVar31._12_4_;
      auVar44._12_4_ = ABS(fVar42);
      auVar46._0_4_ = ((float)DAT_001a79c0 - ABS(fVar32)) * 0.5;
      auVar46._4_4_ = (DAT_001a79c0._4_4_ - ABS(fVar38)) * 0.5;
      auVar46._8_4_ = (DAT_001a79c0._8_4_ - auVar44._8_4_) * 0.5;
      auVar46._12_4_ = (DAT_001a79c0._12_4_ - auVar44._12_4_) * 0.5;
      iVar19 = -(uint)(0.5 < ABS(fVar32));
      iVar22 = -(uint)(0.5 < ABS(fVar38));
      iVar24 = -(uint)(0.5 < auVar44._8_4_);
      iVar26 = -(uint)(0.5 < auVar44._12_4_);
      auVar35._0_4_ = fVar32 * fVar32;
      auVar35._4_4_ = fVar38 * fVar38;
      auVar35._8_4_ = fVar40 * fVar40;
      auVar35._12_4_ = fVar42 * fVar42;
      auVar2._4_4_ = iVar22;
      auVar2._0_4_ = iVar19;
      auVar2._8_4_ = iVar24;
      auVar2._12_4_ = iVar26;
      auVar31 = blendvps(auVar35,auVar46,auVar2);
      auVar47 = sqrtps(auVar46,auVar31);
      auVar3._4_4_ = iVar22;
      auVar3._0_4_ = iVar19;
      auVar3._8_4_ = iVar24;
      auVar3._12_4_ = iVar26;
      auVar47 = blendvps(auVar44,auVar47,auVar3);
      fVar33 = auVar31._0_4_;
      fVar39 = auVar31._4_4_;
      fVar41 = auVar31._8_4_;
      fVar43 = auVar31._12_4_;
      fVar15 = ctx->m;
      fVar16 = ctx->c;
      auVar36._0_4_ =
           fVar33 * auVar47._0_4_ *
           ((((fVar33 * 0.0421632 + 0.024181312) * fVar33 + 0.045470025) * fVar33 + 0.074953005) *
            fVar33 + 0.16666752) + auVar47._0_4_;
      auVar36._4_4_ =
           fVar39 * auVar47._4_4_ *
           ((((fVar39 * 0.0421632 + 0.024181312) * fVar39 + 0.045470025) * fVar39 + 0.074953005) *
            fVar39 + 0.16666752) + auVar47._4_4_;
      auVar36._8_4_ =
           fVar41 * auVar47._8_4_ *
           ((((fVar41 * 0.0421632 + 0.024181312) * fVar41 + 0.045470025) * fVar41 + 0.074953005) *
            fVar41 + 0.16666752) + auVar47._8_4_;
      auVar36._12_4_ =
           fVar43 * auVar47._12_4_ *
           ((((fVar43 * 0.0421632 + 0.024181312) * fVar43 + 0.045470025) * fVar43 + 0.074953005) *
            fVar43 + 0.16666752) + auVar47._12_4_;
      auVar4._4_4_ = iVar22;
      auVar4._0_4_ = iVar19;
      auVar4._8_4_ = iVar24;
      auVar4._12_4_ = iVar26;
      auVar12._4_4_ = 1.5707964 - (auVar36._4_4_ + auVar36._4_4_);
      auVar12._0_4_ = 1.5707964 - (auVar36._0_4_ + auVar36._0_4_);
      auVar12._8_4_ = 1.5707964 - (auVar36._8_4_ + auVar36._8_4_);
      auVar12._12_4_ = 1.5707964 - (auVar36._12_4_ + auVar36._12_4_);
      auVar31 = blendvps(auVar36,auVar12,auVar4);
      auVar37._0_4_ = (float)(auVar31._0_4_ ^ (uint)fVar32 & 0x80000000);
      auVar37._4_4_ = (float)(auVar31._4_4_ ^ (uint)fVar38 & 0x80000000);
      auVar37._8_4_ = (float)(auVar31._8_4_ ^ (uint)fVar40 & 0x80000000);
      auVar37._12_4_ = (float)(auVar31._12_4_ ^ (uint)fVar42 & 0x80000000);
      auVar5._4_4_ = iVar21;
      auVar5._0_4_ = iVar17;
      auVar5._8_4_ = iVar23;
      auVar5._12_4_ = iVar25;
      auVar9._4_4_ = auVar37._4_4_ + auVar37._4_4_;
      auVar9._0_4_ = auVar37._0_4_ + auVar37._0_4_;
      auVar9._8_4_ = auVar37._8_4_ + auVar37._8_4_;
      auVar9._12_4_ = auVar37._12_4_ + auVar37._12_4_;
      auVar31 = blendvps(auVar37,auVar9,auVar5);
      auVar6._4_4_ = -(uint)(fVar28 < -0.5);
      auVar6._0_4_ = -(uint)(fVar27 < -0.5);
      auVar6._8_4_ = -(uint)(in_XMM0_Dc < -0.5);
      auVar6._12_4_ = -(uint)(in_XMM0_Dd < -0.5);
      auVar11._4_4_ = 3.1415927 - auVar31._4_4_;
      auVar11._0_4_ = 3.1415927 - auVar31._0_4_;
      auVar11._8_4_ = 3.1415927 - auVar31._8_4_;
      auVar11._12_4_ = 3.1415927 - auVar31._12_4_;
      auVar31 = blendvps(auVar31,auVar11,auVar6);
      auVar45._0_4_ = 1.5707964 - auVar31._0_4_;
      auVar45._4_4_ = 1.5707964 - auVar31._4_4_;
      auVar45._8_4_ = 1.5707964 - auVar31._8_4_;
      auVar45._12_4_ = 1.5707964 - auVar31._12_4_;
      auVar7._4_4_ = iVar21;
      auVar7._0_4_ = iVar17;
      auVar7._8_4_ = iVar23;
      auVar7._12_4_ = iVar25;
      auVar31 = blendvps(auVar45,auVar31,auVar7);
      auVar8._4_4_ = iVar20;
      auVar8._0_4_ = iVar18;
      auVar8._8_4_ = -(uint)(in_XMM0_Dc < fVar13);
      auVar8._12_4_ = -(uint)(in_XMM0_Dd < fVar13);
      auVar10._4_4_ = -(uint)(fVar14 < fVar28) & (uint)(fVar16 + auVar31._4_4_ * fVar15);
      auVar10._0_4_ = -(uint)(fVar14 < fVar27) & (uint)(fVar16 + auVar31._0_4_ * fVar15);
      auVar10._8_4_ = -(uint)(fVar14 < in_XMM0_Dc) & (uint)(fVar16 + auVar31._8_4_ * fVar15);
      auVar10._12_4_ = -(uint)(fVar14 < in_XMM0_Dd) & (uint)(fVar16 + auVar31._12_4_ * fVar15);
      auVar31 = blendvps(_DAT_001a79c0,auVar10,auVar8);
      uVar29 = auVar31._0_8_;
    }
  }
  bVar48.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)iVar20;
  bVar48.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)iVar18;
  bVar48.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar29;
  bVar48.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)((ulong)uVar29 >> 0x20);
  return (batch)bVar48.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }